

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::SSARewriter::GenerateSSAReplacements(SSARewriter *this,BasicBlock *bb)

{
  Instruction *pIVar1;
  Op OVar2;
  Instruction *inst_00;
  bool bVar3;
  Instruction *inst;
  
  inst_00 = &(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar1 = &(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
LAB_0018db9e:
  do {
    while( true ) {
      inst_00 = *(Instruction **)
                 ((long)&inst_00->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
      if (inst_00 == pIVar1) {
        SealBlock(this,bb);
        goto LAB_0018dbeb;
      }
      OVar2 = inst_00->opcode_;
      if (OVar2 != OpStore) break;
LAB_0018dbb8:
      ProcessStore(this,inst_00,bb);
    }
    if (OVar2 != OpLoad) {
      if (OVar2 == OpVariable) goto LAB_0018dbb8;
      goto LAB_0018db9e;
    }
    bVar3 = ProcessLoad(this,inst_00,bb);
    if (!bVar3) {
LAB_0018dbeb:
      return inst_00 == pIVar1;
    }
  } while( true );
}

Assistant:

bool SSARewriter::GenerateSSAReplacements(BasicBlock* bb) {
#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  std::cerr << "Generating SSA replacements for block: " << bb->id() << "\n";
  std::cerr << bb->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
            << "\n";
#endif

  for (auto& inst : *bb) {
    auto opcode = inst.opcode();
    if (opcode == spv::Op::OpStore || opcode == spv::Op::OpVariable) {
      ProcessStore(&inst, bb);
    } else if (inst.opcode() == spv::Op::OpLoad) {
      if (!ProcessLoad(&inst, bb)) {
        return false;
      }
    }
  }

  // Seal |bb|. This means that all the stores in it have been scanned and
  // it's ready to feed them into its successors.
  SealBlock(bb);

#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  PrintPhiCandidates();
  PrintReplacementTable();
  std::cerr << "\n\n";
#endif
  return true;
}